

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImVec2 *out_b;
  long lVar1;
  ImGuiWindow_conflict *pIVar2;
  ImDrawIdx *pIVar3;
  ImDrawVert *pIVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined4 col_00;
  uint uVar16;
  ImU32 IVar17;
  ImU32 IVar18;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined7 uVar20;
  undefined7 extraout_var_01;
  char *text_end;
  void *pvVar19;
  undefined7 extraout_var_02;
  float *pfVar21;
  byte bVar22;
  ImVec2 *pIVar23;
  int iVar24;
  uint uVar25;
  undefined1 this [8];
  char cVar26;
  ImGuiContext *g;
  long lVar27;
  ImGuiContext_conflict1 *pIVar28;
  bool bVar29;
  uint uVar30;
  int iVar31;
  float fVar32;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 IVar34;
  float fVar33;
  float fVar36;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 auVar35 [16];
  float extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  ulong extraout_XMM0_Qb;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float V;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 current_off_unrotated;
  float vv;
  ImVec2 picker_pos;
  ImVec2 tra;
  float ww;
  float uu;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_26c;
  float local_268;
  float local_264;
  undefined4 local_260;
  float local_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  ImVec2 *local_230;
  undefined1 local_228 [8];
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_214;
  float local_210;
  float local_20c;
  ImVec2 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  ImVec2 local_1e8;
  ImU32 local_1e0;
  uint local_1dc;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  float local_1c8;
  float fStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  ImVec2 local_1b8;
  undefined8 uStack_1b0;
  ImGuiContext_conflict1 *local_1a8;
  ImVec2 local_1a0;
  ImVec2 local_198;
  float fStack_190;
  float fStack_18c;
  int local_188;
  int local_184;
  uint local_180;
  float local_178;
  float fStack_174;
  uint uStack_170;
  uint uStack_16c;
  undefined1 local_160 [8];
  ImVec2 local_158;
  ImVec2 local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ImVec2 local_128;
  ImVec2 local_120;
  undefined1 local_118 [16];
  ImU32 local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  ImVec4 local_d8;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  size_t local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar46 [16];
  
  pIVar28 = GImGui;
  local_e8._8_8_ = local_e8._0_8_;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems != false) {
    bVar22 = 0;
    goto LAB_001ed6c7;
  }
  uStack_1f0 = local_1f8;
  local_1f8 = (undefined1  [8])pIVar2->DrawList;
  local_208 = (ImVec2)ref_col;
  local_258._0_4_ = CalcItemWidth();
  local_258._4_4_ = extraout_XMM0_Db;
  fStack_250 = (float)extraout_XMM0_Dc;
  fStack_24c = (float)extraout_XMM0_Dd;
  (pIVar28->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar25 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar25);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar16 = pIVar28->ColorEditOptions & 0x6000000;
    uVar30 = 0x2000000;
    if (uVar16 != 0) {
      uVar30 = uVar16;
    }
    uVar25 = uVar25 | uVar30;
  }
  if ((uVar25 & 0x18000000) == 0) {
    uVar16 = pIVar28->ColorEditOptions & 0x18000000;
    uVar30 = 0x8000000;
    if (uVar16 != 0) {
      uVar30 = uVar16;
    }
    uVar25 = uVar25 | uVar30;
  }
  uVar30 = (uVar25 & 0x6000000) - 1;
  if ((uVar25 & 0x6000000 ^ uVar30) <= uVar30) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x13f7,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar30 = (uVar25 & 0x18000000) - 1;
  pfVar21 = (float *)(ulong)uVar30;
  if ((uVar25 & 0x18000000 ^ uVar30) <= uVar30) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x13f8,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  local_e8._0_8_ = label;
  if ((uVar25 & 8) == 0) {
    uVar25 = uVar25 | pIVar28->ColorEditOptions & 0x10000U;
  }
  local_1dc = uVar25 & 0x10002;
  bVar29 = local_1dc == 0x10000;
  IVar34 = (pIVar2->DC).CursorPos;
  local_230 = (ImVec2 *)col;
  local_150 = IVar34;
  local_178 = GetFrameHeight();
  pIVar23 = local_230;
  local_1a8 = pIVar28;
  fVar41 = (pIVar28->Style).ItemInnerSpacing.x;
  local_138 = ZEXT416((uint)fVar41);
  fVar41 = (float)local_258._0_4_ - (local_178 + fVar41) * (float)(byte)(bVar29 + 1);
  uVar30 = -(uint)(fVar41 <= local_178);
  fStack_1c4 = (float)(local_258._4_4_ & (uint)extraout_XMM0_Db_00);
  uStack_1c0 = (uint)fStack_250 & extraout_XMM0_Dc_00;
  uStack_1bc = (uint)fStack_24c & extraout_XMM0_Dd_00;
  local_1c8 = (float)(uVar30 & (uint)local_178 | ~uVar30 & (uint)fVar41);
  local_b8 = (ulong)((uVar25 & 2) == 0) * 4 + 0xc;
  fStack_174 = extraout_XMM0_Db_00;
  uStack_170 = extraout_XMM0_Dc_00;
  uStack_16c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_230,local_b8);
  local_25c = local_1c8 * 0.08;
  local_98 = ZEXT416((uint)(local_1c8 * 0.5));
  local_1d0.x = local_1c8 * 0.5 - local_25c;
  _local_c8 = ZEXT416((uint)local_1d0.x);
  local_78._0_4_ = IVar34.x;
  local_88 = local_1c8 + (float)local_78._0_4_;
  fStack_84 = fStack_1c4;
  uStack_80 = uStack_1c0;
  uStack_7c = uStack_1bc;
  uStack_1b0 = 0;
  local_f8 = (local_178 + local_1c8) * 0.5 + (float)local_78._0_4_;
  fStack_f4 = local_1c8 * 0.5 + IVar34.y;
  fStack_f0 = fStack_174 * 0.0 + 0.0;
  fStack_ec = fStack_1c4 * 0.0 + 0.0;
  local_1e8.y = fStack_f4;
  local_1e8.x = local_f8;
  local_1d0.x = local_1d0.x - (float)(int)(local_1c8 * 0.027);
  local_1a0.x = local_1d0.x * -0.5;
  local_1a0.y = local_1d0.x * -0.866025;
  local_1d0.y = 0.0;
  local_1d8.y = local_1d0.x * 0.866025;
  local_26c = pIVar23->x;
  local_268 = pIVar23->y;
  local_264 = pIVar23[1].x;
  local_258._4_4_ = local_138._4_4_;
  local_258._0_4_ = (float)local_138._0_4_ + local_88;
  fStack_250 = (float)local_138._8_4_;
  fStack_24c = (float)local_138._12_4_;
  local_214 = local_264;
  local_210 = local_268;
  local_20c = local_26c;
  local_1d8.x = local_1a0.x;
  local_1b8 = IVar34;
  if ((uVar25 >> 0x1b & 1) == 0) {
    this = local_1f8;
    fVar41 = (float)local_138._0_4_ + local_88;
    if ((uVar25 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_26c,local_268,local_264,&local_20c,&local_210,&local_214);
      fVar41 = (float)local_258._0_4_;
    }
  }
  else {
    pfVar21 = &local_264;
    ColorConvertRGBtoHSV(local_26c,local_268,local_264,&local_26c,&local_268,pfVar21);
    pIVar23 = local_230;
    ColorEditRestoreHS(&local_230->x,&local_26c,&local_268,pfVar21);
    this = local_1f8;
    fVar41 = (float)local_258._0_4_;
  }
  local_248._4_4_ = fStack_174;
  local_248._0_4_ = local_178 + fVar41;
  fStack_240 = (float)uStack_170;
  fStack_23c = (float)uStack_16c;
  PushItemFlag(8,true);
  pIVar28 = local_1a8;
  if ((uVar25 >> 0x1a & 1) == 0) {
    if ((uVar25 >> 0x19 & 1) == 0) {
      auVar7._12_4_ = 0;
      auVar7._0_12_ = local_148._4_12_;
      local_148 = auVar7 << 0x20;
      local_260 = 0;
      auVar5._12_4_ = 0;
      auVar5._0_12_ = stack0xfffffffffffffddc;
      _local_228 = auVar5 << 0x20;
    }
    else {
      local_198.y = local_1c8;
      local_198.x = local_1c8;
      auVar9._12_4_ = 0;
      auVar9._0_12_ = local_148._4_12_;
      local_148 = auVar9 << 0x20;
      InvisibleButton("sv",&local_198,0);
      bVar29 = IsItemActive();
      if (bVar29) {
        auVar35._0_4_ = local_1c8 + -1.0;
        IVar34 = (pIVar28->IO).MousePos;
        auVar37._0_4_ = IVar34.x - local_1b8.x;
        auVar37._4_4_ = IVar34.y - local_1b8.y;
        auVar37._8_4_ = 0.0 - (float)uStack_1b0;
        auVar37._12_4_ = 0.0 - uStack_1b0._4_4_;
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = auVar35._0_4_;
        auVar35._12_4_ = auVar35._0_4_;
        auVar48 = divps(auVar37,auVar35);
        local_264 = 1.0;
        fVar41 = auVar48._0_4_;
        fVar32 = auVar48._4_4_;
        iVar24 = -(uint)(fVar41 < 0.0);
        iVar31 = -(uint)(fVar32 < 0.0);
        auVar47._4_4_ = iVar31;
        auVar47._0_4_ = iVar24;
        auVar47._8_4_ = iVar31;
        auVar47._12_4_ = iVar31;
        auVar46._8_8_ = auVar47._8_8_;
        auVar46._4_4_ = iVar24;
        auVar46._0_4_ = iVar24;
        uVar30 = movmskpd((int)CONCAT71(extraout_var,bVar29),auVar46);
        local_268 = 0.0;
        if (((uVar30 & 1) == 0) && (local_268 = 1.0, fVar41 <= 1.0)) {
          local_268 = fVar41;
        }
        if ((uVar30 & 2) == 0) {
          auVar42 = ZEXT812(0x3f800000);
          if (fVar32 <= auVar42._0_4_) {
            auVar42._4_8_ = auVar42._4_8_;
            auVar42._0_4_ = fVar32;
          }
          local_264 = 1.0 - auVar42._0_4_;
        }
        IVar18 = pIVar28->ColorEditLastColor;
        fStack_190 = pIVar23[1].x;
        local_198 = *pIVar23;
        fStack_18c = 0.0;
        IVar17 = ColorConvertFloat4ToU32((ImVec4 *)&local_198);
        local_148._0_4_ = (int)CONCAT71((int7)((ulong)pfVar21 >> 8),1);
        if (IVar18 == IVar17) {
          local_26c = pIVar28->ColorEditLastHue;
        }
      }
      fVar41 = local_1b8.y;
      if ((uVar25 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
        fVar41 = local_1b8.y;
      }
      local_198.y = fVar41;
      local_198.x = (float)local_258._0_4_;
      SetCursorScreenPos(&local_198);
      local_198.y = local_1c8;
      local_198.x = local_178;
      local_260 = 0;
      InvisibleButton("hue",&local_198,0);
      bVar29 = IsItemActive();
      if (bVar29) {
        fVar41 = ((pIVar28->IO).MousePos.y - local_1b8.y) / (local_1c8 + -1.0);
        local_26c = 1.0;
        if (fVar41 <= 1.0) {
          local_26c = fVar41;
        }
        local_26c = (float)(~-(uint)(fVar41 < 0.0) & (uint)local_26c);
        local_260 = (undefined4)CONCAT71(extraout_var_00,1);
        local_228._0_4_ = (int)CONCAT71(extraout_var_00,1);
      }
      else {
        local_228._0_4_ = local_148._0_4_;
      }
    }
  }
  else {
    local_198.y = local_1c8;
    local_198.x = (local_1a8->Style).ItemInnerSpacing.x + local_1c8 + local_178;
    auVar48._12_4_ = 0;
    auVar48._0_12_ = local_148._4_12_;
    local_148 = auVar48 << 0x20;
    InvisibleButton("hsv",&local_198,0);
    bVar29 = IsItemActive();
    local_260 = 0;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = stack0xfffffffffffffddc;
    _local_228 = auVar8 << 0x20;
    if (bVar29) {
      fVar49 = (pIVar28->IO).MouseClickedPos[0].x - local_f8;
      fVar45 = (pIVar28->IO).MouseClickedPos[0].y - fStack_f4;
      fVar32 = (pIVar28->IO).MousePos.x - local_f8;
      local_a8 = ZEXT416((uint)fVar32);
      fVar41 = (pIVar28->IO).MousePos.y - fStack_f4;
      local_148 = ZEXT416((uint)fVar41);
      _local_228 = ZEXT416((uint)fVar45);
      local_118 = ZEXT416((uint)fVar49);
      fVar45 = fVar49 * fVar49 + fVar45 * fVar45;
      if ((fVar45 < ((float)local_c8._0_4_ + -1.0) * ((float)local_c8._0_4_ + -1.0)) ||
         (((float)local_98._0_4_ + 1.0) * ((float)local_98._0_4_ + 1.0) < fVar45)) {
        local_260 = 0;
      }
      else {
        fVar41 = atan2f(fVar41,fVar32);
        fVar41 = (fVar41 / 3.1415927) * 0.5;
        local_26c = (float)(~-(uint)(fVar41 < 0.0) & (uint)fVar41 |
                           (uint)(fVar41 + 1.0) & -(uint)(fVar41 < 0.0));
        local_260 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_f8 = cosf(local_26c * -2.0 * 3.1415927);
      fStack_f4 = extraout_XMM0_Db_01;
      fStack_f0 = extraout_XMM0_Dc_01;
      fStack_ec = extraout_XMM0_Dd_01;
      fVar41 = sinf(local_26c * -2.0 * 3.1415927);
      fVar32 = -(float)local_228._0_4_;
      fVar45 = local_f8 * (float)local_228._0_4_;
      local_228._4_4_ = extraout_XMM0_Db_02;
      local_228._0_4_ = fVar41;
      uStack_220 = extraout_XMM0_Dc_02;
      uStack_21c = extraout_XMM0_Dd_02;
      local_198.x = local_f8 * (float)local_118._0_4_ + fVar32 * fVar41;
      local_198.y = fVar41 * (float)local_118._0_4_ + fVar45;
      bVar29 = ImTriangleContainsPoint(&local_1d0,&local_1a0,&local_1d8,&local_198);
      if (bVar29) {
        local_198.x = local_f8 * (float)local_a8._0_4_ +
                      -(float)local_148._0_4_ * (float)local_228._0_4_;
        local_198.y = (float)local_228._0_4_ * (float)local_a8._0_4_ +
                      local_f8 * (float)local_148._0_4_;
        bVar29 = ImTriangleContainsPoint(&local_1d0,&local_1a0,&local_1d8,&local_198);
        if (!bVar29) {
          local_198 = ImTriangleClosestPoint(&local_1d0,&local_1a0,&local_1d8,&local_198);
        }
        ImTriangleBarycentricCoords
                  (&local_1d0,&local_1a0,&local_1d8,&local_198,&local_d8.x,(float *)local_160,
                   &local_120.x);
        fVar32 = 1.0 - (float)local_160._0_4_;
        fVar41 = 1.0;
        if (fVar32 <= 1.0) {
          fVar41 = fVar32;
        }
        local_264 = (float)(-(uint)(fVar32 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar32 < 0.0001) & (uint)fVar41);
        fVar32 = local_d8.x / local_264;
        fVar41 = 1.0;
        if (fVar32 <= 1.0) {
          fVar41 = fVar32;
        }
        local_268 = (float)(-(uint)(fVar32 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar32 < 0.0001) & (uint)fVar41);
        uVar20 = (undefined7)((ulong)extraout_RAX_00 >> 8);
        local_148._0_4_ = (int)CONCAT71(uVar20,1);
        local_228._0_4_ = (int)CONCAT71(uVar20,1);
        this = local_1f8;
      }
      else {
        auVar6._12_4_ = 0;
        auVar6._0_12_ = local_148._4_12_;
        local_148 = auVar6 << 0x20;
        local_228._0_4_ = local_260;
      }
    }
    if ((uVar25 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_138._0_4_ = (float)local_138._0_4_ + (float)local_248._0_4_;
  if (local_1dc == 0x10000) {
    local_198.y = local_1b8.y;
    local_198.x = (float)local_138._0_4_;
    SetCursorScreenPos(&local_198);
    local_198.y = local_1c8;
    local_198.x = local_178;
    InvisibleButton("alpha",&local_198,0);
    bVar29 = IsItemActive();
    if (bVar29) {
      fVar32 = ((pIVar28->IO).MousePos.y - local_1b8.y) / (local_1c8 + -1.0);
      fVar41 = 1.0;
      if (fVar32 <= 1.0) {
        fVar41 = fVar32;
      }
      pIVar23[1].y = (float)(-(uint)(fVar32 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar32 < 0.0) & (uint)(1.0 - fVar41));
      local_228._0_4_ = (int)CONCAT71(extraout_var_01,1);
    }
  }
  PopItemFlag();
  if ((uVar25 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar28->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if (-1 < (char)uVar25) {
    uVar15 = local_e8._0_8_;
    text_end = FindRenderedTextEnd((char *)local_e8._0_8_,(char *)0x0);
    if (text_end != (char *)uVar15) {
      if ((uVar25 >> 8 & 1) != 0) {
        SameLine(0.0,(pIVar28->Style).ItemInnerSpacing.x);
      }
      TextEx((char *)local_e8._0_8_,text_end,0);
    }
  }
  if ((uVar25 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_198 = *pIVar23;
    fStack_190 = pIVar23[1].x;
    if ((uVar25 & 2) == 0) {
      fStack_18c = pIVar23[1].y;
    }
    else {
      fStack_18c = 1.0;
    }
    if ((char)uVar25 < '\0') {
      Text("Current");
    }
    IVar34.x = local_178 * 3.0;
    IVar34.y = local_178 * 2.0;
    local_e8._8_4_ = local_178 * 0.0;
    local_e8._0_4_ = IVar34.x;
    local_e8._4_4_ = IVar34.y;
    local_e8._12_4_ = local_178 * 0.0;
    ColorButton("##current",(ImVec4 *)&local_198,uVar25 & 0x180e0040,IVar34);
    if (local_208 != (ImVec2)0x0) {
      Text("Original");
      local_d8._0_8_ = *(undefined8 *)local_208;
      local_d8.z = *(float *)((long)local_208 + 8);
      if ((uVar25 & 2) == 0) {
        local_d8.w = *(float *)((long)local_208 + 0xc);
      }
      else {
        local_d8.w = 1.0;
      }
      bVar29 = ColorButton("##original",&local_d8,uVar25 & 0x180e0040,(ImVec2)local_e8._0_8_);
      if (bVar29) {
        pvVar19 = memcpy(pIVar23,(void *)local_208,local_b8);
        local_228._0_4_ = (int)CONCAT71((int7)((ulong)pvVar19 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  fVar41 = local_178 * 0.2;
  fVar32 = 0.0;
  fVar45 = 0.0;
  fVar49 = 0.0;
  pfVar21 = &pIVar23->y;
  out_b = pIVar23 + 1;
  if (((char)local_260 != '\0') || (local_148[0] != '\0')) {
    if ((uVar25 >> 0x1b & 1) == 0) {
      if ((uVar25 >> 0x1c & 1) != 0) {
        pIVar23->x = local_26c;
        pIVar23->y = local_268;
        pIVar23[1].x = local_264;
      }
    }
    else {
      local_208.y = 0.0;
      local_208.x = fVar41;
      uStack_200 = 0;
      ColorConvertHSVtoRGB(local_26c,local_268,local_264,&pIVar23->x,pfVar21,&out_b->x);
      pIVar28->ColorEditLastHue = local_26c;
      pIVar28->ColorEditLastSat = local_268;
      fStack_190 = pIVar23[1].x;
      local_198 = *pIVar23;
      fStack_18c = 0.0;
      IVar18 = ColorConvertFloat4ToU32((ImVec4 *)&local_198);
      pIVar28->ColorEditLastColor = IVar18;
      fVar41 = local_208.x;
      fVar32 = local_208.y;
      fVar45 = (float)uStack_200;
      fVar49 = uStack_200._4_4_;
    }
  }
  fVar33 = (float)(int)fVar41;
  fVar36 = (float)(int)fVar32;
  iVar24 = (int)fVar45;
  iVar31 = (int)fVar49;
  if ((uVar25 & 0x20) == 0) {
    local_208.y = (float)(int)fVar32;
    local_208.x = (float)(int)fVar41;
    uStack_200 = CONCAT44((int)fVar49,(int)fVar45);
    fVar41 = (float)local_138._0_4_;
    if (local_1dc != 0x10000) {
      fVar41 = (float)local_258._0_4_;
    }
    PushItemWidth((fVar41 + local_178) - (float)local_78._0_4_);
    uVar30 = uVar25 & 0x198e001a;
    cVar26 = '\x01';
    if (((uVar25 >> 0x14 & 1) != 0 || (uVar25 & 0x600000) == 0) &&
       (bVar29 = ColorEdit4("##rgb",&local_230->x,uVar30 | 0x100004), bVar29)) {
      local_228._0_4_ = (int)CONCAT71(extraout_var_02,1);
      if (local_1a8->ActiveId == 0) {
        cVar26 = '\x01';
      }
      else {
        cVar26 = local_1a8->ActiveIdAllowOverlap;
      }
    }
    if ((uVar25 >> 0x15 & 1) != 0 || (uVar25 & 0x500000) == 0) {
      bVar29 = ColorEdit4("##hsv",&local_230->x,uVar30 | 0x200004);
      auVar48 = _local_228;
      local_228._1_3_ = local_228._1_3_;
      local_228[0] = local_228[0] | bVar29;
      stack0xfffffffffffffddc = auVar48._4_12_;
    }
    if ((uVar25 >> 0x16 & 1) != 0 || (uVar25 & 0x300000) == 0) {
      bVar29 = ColorEdit4("##hex",&local_230->x,uVar30 | 0x400004);
      auVar48 = _local_228;
      local_228._1_3_ = local_228._1_3_;
      local_228[0] = local_228[0] | bVar29;
      stack0xfffffffffffffddc = auVar48._4_12_;
    }
    PopItemWidth();
    pIVar23 = local_230;
    pIVar28 = local_1a8;
    if ((uVar25 >> 0x1b & 1) != 0 && cVar26 == '\0') {
      ColorConvertRGBtoHSV
                (local_230->x,local_230->y,local_230[1].x,&local_198.x,&local_d8.x,
                 (float *)local_160);
      pIVar28 = local_1a8;
      this = local_1f8;
      if ((local_198.x <= 0.0) && (0.0 < local_26c)) {
        if (0.0 < (float)local_160._0_4_) {
LAB_001ec951:
          if (0.0 < local_d8.x) goto LAB_001ec977;
          fVar41 = local_268 * 0.5;
        }
        else {
          if ((local_264 == (float)local_160._0_4_) &&
             (!NAN(local_264) && !NAN((float)local_160._0_4_))) goto LAB_001ec951;
          local_160._0_4_ = local_264 * 0.5;
          fVar41 = local_268;
        }
        ColorConvertHSVtoRGB(local_26c,fVar41,(float)local_160._0_4_,&pIVar23->x,pfVar21,&out_b->x);
      }
    }
LAB_001ec977:
    fVar33 = local_208.x;
    fVar36 = local_208.y;
    iVar24 = (int)(float)uStack_200;
    iVar31 = (int)uStack_200._4_4_;
  }
  local_68 = (float)(int)fVar33;
  fStack_64 = (float)(int)fVar36;
  fStack_60 = (float)iVar24;
  fStack_5c = (float)iVar31;
  if (local_228[0] != '\0') {
    if ((uVar25 >> 0x1b & 1) == 0) {
      if ((uVar25 >> 0x1c & 1) != 0) {
        local_26c = pIVar23->x;
        local_268 = pIVar23->y;
        local_264 = pIVar23[1].x;
        ColorConvertHSVtoRGB(local_26c,local_268,local_264,&local_20c,&local_210,&local_214);
      }
    }
    else {
      local_20c = pIVar23->x;
      local_210 = pIVar23->y;
      local_214 = pIVar23[1].x;
      ColorConvertRGBtoHSV(local_20c,local_210,local_214,&local_26c,&local_268,&local_264);
      this = local_1f8;
      ColorEditRestoreHS(&pIVar23->x,&local_26c,&local_268,&local_264);
    }
  }
  local_d8.w = (pIVar28->Style).Alpha;
  fVar41 = 1.0;
  if (local_d8.w <= 1.0) {
    fVar41 = local_d8.w;
  }
  iVar24 = (int)((float)(~-(uint)(local_d8.w < 0.0) & (uint)fVar41) * 255.0 + 0.5);
  local_d8.x = 1.0;
  local_d8.y = 1.0;
  local_d8.z = 1.0;
  uVar30 = iVar24 * 0x1000000;
  local_b0 = (ulong)uVar30;
  local_188 = uVar30 + 0xff0000;
  uVar16 = iVar24 << 0x18;
  local_180 = uVar16 | 0xff;
  fStack_190 = (float)(iVar24 << 0x18 | 0xff00);
  fStack_18c = (float)(iVar24 << 0x18 | 0xffff00);
  local_208 = (ImVec2)(CONCAT44(iVar24 << 0x18,uVar16) | 0xffff000000ff);
  uStack_200 = CONCAT44(iVar24 << 0x18,iVar24 << 0x18) | 0xffff000000ff00;
  local_118._0_4_ = uVar30 + 0xffffff;
  local_198 = (ImVec2)(CONCAT44(iVar24 << 0x18,uVar16) | 0xffff000000ff);
  local_184 = uVar30 + 0xff00ff;
  local_a8._0_4_ = uVar30 + 0x808080;
  ColorConvertHSVtoRGB(local_26c,1.0,1.0,&local_d8.x,&local_d8.y,&local_d8.z);
  IVar17 = ColorConvertFloat4ToU32(&local_d8);
  local_160._4_4_ = local_210;
  local_160._0_4_ = local_20c;
  local_158.y = (pIVar28->Style).Alpha;
  local_158.x = local_214;
  IVar18 = ColorConvertFloat4ToU32((ImVec4 *)local_160);
  fVar41 = local_208.x;
  local_120.x = 0.0;
  local_120.y = 0.0;
  uVar14 = local_118._0_4_;
  if ((uVar25 >> 0x1a & 1) == 0) {
    if ((uVar25 >> 0x19 & 1) != 0) {
      local_160._4_4_ = local_1b8.y + local_1c8;
      local_160._0_4_ = local_88;
      local_1e0 = IVar18;
      ImDrawList::AddRectFilledMultiColor
                ((ImDrawList *)this,&local_150,(ImVec2 *)local_160,local_118._0_4_,IVar17,IVar17,
                 local_118._0_4_);
      local_1f8._4_4_ = local_1c8;
      local_1f8._0_4_ = local_1c8;
      uStack_1f0._0_4_ = local_1c8;
      uStack_1f0._4_4_ = local_1c8;
      local_160._0_4_ = local_150.x + local_1c8;
      local_160._4_4_ = local_150.y + local_1c8;
      ImDrawList::AddRectFilledMultiColor
                ((ImDrawList *)this,&local_150,(ImVec2 *)local_160,0,0,(ImU32)local_b0,
                 (ImU32)local_b0);
      p_max.x = (float)local_1f8._0_4_ + local_150.x;
      p_max.y = (float)local_1f8._4_4_ + local_150.y;
      RenderFrameBorder(local_150,p_max,0.0);
      auVar43._4_4_ = 1.0 - local_264;
      auVar43._0_4_ = local_268;
      auVar43._8_8_ = 0;
      auVar48 = minps(_DAT_001ff530,auVar43);
      fVar32 = local_150.x;
      fVar45 = local_150.y;
      auVar38._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_268) & auVar48._0_4_) * (float)local_1f8._0_4_
                        + fVar32 + 0.5);
      auVar38._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_264) & auVar48._4_4_) *
                        (float)local_1f8._4_4_ + fVar45 + 0.5);
      auVar38._8_4_ = (float)(int)(auVar48._8_4_ * (float)uStack_1f0 + 0.0 + 0.0);
      auVar38._12_4_ = (float)(int)(auVar48._12_4_ * uStack_1f0._4_4_ + 0.0 + 0.0);
      auVar44._0_4_ = (float)local_1f8._0_4_ + fVar32 + -2.0;
      auVar44._4_4_ = (float)local_1f8._4_4_ + fVar45 + -2.0;
      auVar44._8_4_ = (float)uStack_1f0 + 0.0 + 0.0;
      auVar44._12_4_ = uStack_1f0._4_4_ + 0.0 + 0.0;
      auVar48 = minps(auVar44,auVar38);
      uVar25 = -(uint)(auVar38._0_4_ < fVar32 + 2.0);
      uVar30 = -(uint)(auVar38._4_4_ < fVar45 + 2.0);
      local_120 = (ImVec2)(CONCAT44(~uVar30 & auVar48._4_4_,~uVar25 & auVar48._0_4_) |
                          CONCAT44((uint)(fVar45 + 2.0) & uVar30,(uint)(fVar32 + 2.0) & uVar25));
      local_1f8._4_4_ = fStack_1c4;
      local_1f8._0_4_ = local_1c8 / 6.0;
      uStack_1f0._0_4_ = (float)uStack_1c0;
      uStack_1f0._4_4_ = (float)uStack_1bc;
      lVar27 = 0;
      do {
        local_160._4_4_ = (float)(int)lVar27 * (float)local_1f8._0_4_ + local_150.y;
        local_160._0_4_ = local_258._0_4_;
        lVar1 = lVar27 + 1;
        local_128.y = (float)(int)lVar1 * (float)local_1f8._0_4_ + local_150.y;
        local_128.x = (float)local_248._0_4_;
        fVar32 = (&local_198.y)[lVar27];
        ImDrawList::AddRectFilledMultiColor
                  ((ImDrawList *)this,(ImVec2 *)local_160,&local_128,(ImU32)fVar41,(ImU32)fVar41,
                   (ImU32)fVar32,(ImU32)fVar32);
        lVar27 = lVar1;
        fVar41 = fVar32;
      } while (lVar1 != 6);
      _local_1f8 = ZEXT416((uint)(float)(int)(local_26c * local_1c8 + local_150.y + 0.5));
      p_min.y = local_150.y;
      p_min.x = (float)local_258._0_4_;
      p_max_00.y = local_1c8 + local_150.y;
      p_max_00.x = (float)local_248._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pIVar28 = local_1a8;
      pos.x = (float)local_258._0_4_ + -1.0;
      pos.y = (float)local_1f8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar
                ((ImDrawList *)this,pos,half_sz,local_178 + 2.0,(local_1a8->Style).Alpha);
      IVar18 = local_1e0;
    }
  }
  else {
    local_78 = ZEXT416((uint)(0.5 / (float)local_98._0_4_));
    local_88 = 5.60519e-45;
    if (4 < (int)(float)local_98._0_4_ / 0xc) {
      local_88 = (float)((int)(float)local_98._0_4_ / 0xc);
    }
    local_f8 = -(0.5 / (float)local_98._0_4_);
    fStack_f4 = -0.0;
    fStack_f0 = -0.0;
    fStack_ec = -0.0;
    local_98._0_4_ = (float)local_98._0_4_ + (float)local_c8._0_4_;
    local_e8._0_4_ = (float)local_98._0_4_ * 0.5;
    local_c8._4_4_ = local_c8._0_4_;
    fStack_c0 = (float)local_c8._0_4_;
    fStack_bc = (float)local_c8._0_4_;
    lVar27 = 0;
    local_1e0 = IVar18;
    local_fc = IVar17;
    do {
      fVar32 = (float)(int)lVar27 / 6.0;
      fVar32 = (fVar32 + fVar32) * 3.1415927 + local_f8;
      local_208.x = fVar32;
      fVar45 = ((float)(int)lVar27 + 1.0) / 6.0;
      fVar45 = (fVar45 + fVar45) * 3.1415927 + (float)local_78._0_4_;
      local_1b8.x = fVar45;
      iVar24 = (((ImDrawList *)this)->VtxBuffer).Size;
      ImDrawList::PathArcTo
                ((ImDrawList *)this,&local_1e8,(float)local_e8._0_4_,fVar32,fVar45,(int)local_88);
      ImDrawList::AddPolyline
                ((ImDrawList *)this,(((ImDrawList *)this)->_Path).Data,
                 (((ImDrawList *)this)->_Path).Size,uVar14,0,local_25c);
      (((ImDrawList *)this)->_Path).Size = 0;
      iVar31 = *(int *)((long)local_1f8 + 0x20);
      _local_248 = ZEXT416((uint)local_1e8.x);
      local_258._0_4_ = cosf(local_208.x);
      local_258._4_4_ = extraout_XMM0_Db_03;
      fStack_250 = (float)extraout_XMM0_Dc_03;
      fStack_24c = (float)extraout_XMM0_Dd_03;
      auVar39._4_4_ = local_1e8.y;
      auVar39._0_4_ = local_248._0_4_;
      auVar39._8_4_ = local_248._4_4_;
      auVar39._12_4_ = 0;
      _local_248 = auVar39;
      fVar32 = sinf(local_208.x);
      fVar45 = (float)local_258._4_4_ * fStack_c0;
      local_258._4_4_ = fVar32 * (float)local_c8._4_4_ + (float)local_248._4_4_;
      local_258._0_4_ = (float)local_258._0_4_ * (float)local_c8._0_4_ + (float)local_248._0_4_;
      fStack_250 = fVar45 + fStack_240;
      fStack_24c = extraout_XMM0_Db_04 * fStack_bc + fStack_23c;
      _local_248 = ZEXT416((uint)local_1e8.x);
      local_208.x = cosf(local_1b8.x);
      local_208.y = extraout_XMM0_Db_05;
      uStack_200 = CONCAT44(extraout_XMM0_Dd_04,extraout_XMM0_Dc_04);
      auVar40._4_4_ = local_1e8.y;
      auVar40._0_4_ = local_248._0_4_;
      auVar40._8_4_ = local_248._4_4_;
      auVar40._12_4_ = 0;
      _local_248 = auVar40;
      fVar32 = sinf(local_1b8.x);
      gradient_p1.x = local_208.x * (float)local_c8._0_4_ + (float)local_248._0_4_;
      gradient_p1.y = fVar32 * (float)local_c8._4_4_ + (float)local_248._4_4_;
      fVar32 = (&local_198.y)[lVar27];
      lVar27 = lVar27 + 1;
      this = local_1f8;
      ShadeVertsLinearColorGradientKeepAlpha
                ((ImDrawList *)local_1f8,iVar24,iVar31,(ImVec2)local_258,gradient_p1,(ImU32)fVar41,
                 (ImU32)fVar32);
      fVar41 = fVar32;
    } while (lVar27 != 6);
    local_258._0_4_ = cosf((local_26c + local_26c) * 3.1415927);
    local_258._4_4_ = extraout_XMM0_Db_06;
    fStack_250 = (float)extraout_XMM0_Dc_05;
    fStack_24c = (float)extraout_XMM0_Dd_05;
    local_248._0_4_ = sinf((local_26c + local_26c) * 3.1415927);
    IVar18 = local_fc;
    local_248._4_4_ = extraout_XMM0_Db_07;
    fStack_240 = (float)extraout_XMM0_Dc_06;
    fStack_23c = (float)extraout_XMM0_Dd_06;
    local_160._0_4_ = (float)local_258._0_4_ * (float)local_98._0_4_ * 0.5 + local_1e8.x;
    local_160._4_4_ = (float)local_248._0_4_ * (float)local_98._0_4_ * 0.5 + local_1e8.y;
    if ((char)local_260 == '\0') {
      fVar41 = 0.55;
    }
    else {
      fVar41 = 0.65;
    }
    uVar14 = local_118._0_4_;
    local_25c = local_25c * fVar41;
    iVar24 = 0x20;
    if ((int)(local_25c / 1.4) < 0x20) {
      iVar24 = (int)(local_25c / 1.4);
    }
    iVar31 = 9;
    if (9 < iVar24) {
      iVar31 = iVar24;
    }
    ImDrawList::AddCircleFilled((ImDrawList *)this,(ImVec2 *)local_160,local_25c,local_fc,iVar31);
    col_00 = local_a8._0_4_;
    ImDrawList::AddCircle
              ((ImDrawList *)this,(ImVec2 *)local_160,local_25c + 1.0,local_a8._0_4_,iVar31,1.0);
    ImDrawList::AddCircle((ImDrawList *)this,(ImVec2 *)local_160,local_25c,uVar14,iVar31,1.0);
    uVar12 = local_248._0_4_;
    uVar13 = local_248._4_4_;
    uVar10 = local_258._0_4_;
    uVar11 = local_258._4_4_;
    fVar41 = (float)local_258._4_4_ * 0.0;
    fVar32 = (float)local_258._4_4_ * 0.0;
    local_1b8.x = local_1e8.x;
    local_128.x = local_1d0.x * (float)local_258._0_4_ + -local_1d0.y * (float)local_248._0_4_ +
                  local_1b8.x;
    local_1b8.y = local_1e8.y;
    local_128.y = local_1d0.x * (float)local_248._0_4_ + local_1d0.y * (float)local_258._0_4_ +
                  local_1b8.y;
    local_258._4_4_ = local_128.y;
    local_258._0_4_ = local_128.x;
    fStack_250 = (float)local_248._4_4_ * 0.0 + (float)local_248._4_4_ * -0.0 + 0.0;
    fStack_24c = fVar32 + fVar41 + 0.0;
    fVar41 = (float)local_248._4_4_ * -0.0;
    fVar45 = (float)local_248._4_4_ * 0.0;
    fVar32 = local_1a0.x * (float)uVar10 + -local_1a0.y * (float)local_248._0_4_ + local_1b8.x;
    local_248._4_4_ =
         local_1a0.x * (float)local_248._0_4_ + local_1a0.y * (float)uVar10 + local_1b8.y;
    local_248._0_4_ = fVar32;
    fStack_240 = fVar45 + fVar41 + 0.0;
    fStack_23c = (float)uVar11 * 0.0 + (float)uVar11 * 0.0 + 0.0;
    local_38.y = (float)local_248._4_4_;
    local_38.x = fVar32;
    local_1b8.x = local_1d8.x * (float)uVar10 + -local_1d8.y * (float)uVar12 + local_1b8.x;
    local_1b8.y = local_1d8.x * (float)uVar12 + local_1d8.y * (float)uVar10 + local_1b8.y;
    uStack_1b0 = CONCAT44((float)uVar11 * 0.0 + (float)uVar11 * 0.0 + 0.0,
                          (float)uVar13 * 0.0 + (float)uVar13 * -0.0 + 0.0);
    local_40.y = local_1b8.y;
    local_40.x = local_1b8.x;
    local_208 = GetFontTexUvWhitePixel();
    uStack_200 = extraout_XMM0_Qb;
    ImDrawList::PrimReserve((ImDrawList *)this,6,6);
    auVar8 = _local_248;
    auVar48 = _local_258;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)*(uint *)((long)this + 0x34);
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    (pIVar4->pos).x = (float)local_258._0_4_;
    (pIVar4->pos).y = (float)local_258._4_4_;
    (*(ImDrawVert **)((long)this + 0x48))->uv = local_208;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = IVar18;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar25 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar25;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar25;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_248._0_4_;
    pIVar4[1].pos.y = (float)local_248._4_4_;
    (*(ImDrawVert **)((long)this + 0x48))->uv = local_208;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = IVar18;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar25 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar25;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar25;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos = local_1b8;
    (*(ImDrawVert **)((long)this + 0x48))->uv = local_208;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = uVar14;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar25 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar25;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar25;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_258._0_4_;
    pIVar4[1].pos.y = (float)local_258._4_4_;
    (*(ImDrawVert **)((long)this + 0x48))->uv = local_208;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = 0;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar25 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar25;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar25;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_248._0_4_;
    pIVar4[1].pos.y = (float)local_248._4_4_;
    (*(ImDrawVert **)((long)this + 0x48))->uv = local_208;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = (ImU32)local_b0;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    uVar25 = *(uint *)((long)this + 0x34) + 1;
    *(uint *)((long)this + 0x34) = uVar25;
    pIVar3 = *(ImDrawIdx **)((long)this + 0x50);
    *pIVar3 = (ImDrawIdx)uVar25;
    *(ImDrawIdx **)((long)this + 0x50) = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    (*(ImDrawVert **)((long)this + 0x48))->uv = local_208;
    pIVar4 = *(ImDrawVert **)((long)this + 0x48);
    pIVar4->col = 0;
    *(ImDrawVert **)((long)this + 0x48) = pIVar4 + 1;
    *(uint *)((long)this + 0x34) = *(uint *)((long)this + 0x34) + 1;
    _local_258 = auVar48;
    _local_248 = auVar8;
    ImDrawList::AddTriangle((ImDrawList *)this,&local_128,&local_38,&local_40,col_00,1.5);
    fVar41 = 1.0;
    if (local_268 <= 1.0) {
      fVar41 = local_268;
    }
    fVar41 = (float)(~-(uint)(local_268 < 0.0) & (uint)fVar41);
    fVar45 = 1.0 - local_264;
    fVar32 = 1.0;
    if (fVar45 <= 1.0) {
      fVar32 = fVar45;
    }
    fVar32 = (float)(~-(uint)(fVar45 < 0.0) & (uint)fVar32);
    fVar45 = fVar41 * (local_128.x - local_40.x) + local_40.x;
    fVar41 = fVar41 * (local_128.y - local_40.y) + local_40.y;
    local_120.x = fVar32 * (local_38.x - fVar45) + fVar45;
    local_120.y = fVar32 * (local_38.y - fVar41) + fVar41;
    pIVar28 = local_1a8;
    IVar18 = local_1e0;
  }
  auVar48 = _local_228;
  pIVar23 = local_230;
  if (local_148[0] == '\0') {
    fVar41 = 6.0;
  }
  else {
    fVar41 = 10.0;
  }
  uVar25 = local_228._0_4_;
  local_258._0_4_ = fVar41;
  ImDrawList::AddCircleFilled((ImDrawList *)this,&local_120,fVar41,IVar18,0xc);
  ImDrawList::AddCircle
            ((ImDrawList *)this,&local_120,(float)local_258._0_4_ + 1.0,local_a8._0_4_,0xc,1.0);
  ImDrawList::AddCircle
            ((ImDrawList *)this,&local_120,(float)local_258._0_4_,local_118._0_4_,0xc,1.0);
  if (local_1dc == 0x10000) {
    fVar41 = pIVar23[1].y;
    _local_248 = ZEXT416((uint)fVar41);
    fVar32 = 1.0;
    if (fVar41 <= 1.0) {
      fVar32 = fVar41;
    }
    _local_258 = ZEXT416((uint)(1.0 - fVar32));
    local_160._4_4_ = local_150.y;
    local_160._0_4_ = local_138._0_4_;
    local_158.x = (float)local_138._0_4_ + local_178;
    local_158.y = local_150.y + local_1c8;
    RenderColorRectWithAlphaCheckerboard
              ((ImDrawList *)this,(ImVec2)local_160,local_158,0,
               (local_158.x - (float)local_138._0_4_) * 0.5,(ImVec2)0x0,0.0,0);
    ImDrawList::AddRectFilledMultiColor
              ((ImDrawList *)this,(ImVec2 *)local_160,&local_158,IVar18,IVar18,IVar18 & 0xffffff,
               IVar18 & 0xffffff);
    local_258._4_4_ = (float)(int)(float)(~local_248._4_4_ & local_258._4_4_);
    local_258._0_4_ =
         (float)(int)((float)(-(uint)((float)local_248._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_248._0_4_ < 0.0) & local_258._0_4_) * local_1c8 +
                      local_150.y + 0.5);
    fStack_250 = (float)(int)(float)(~(uint)fStack_240 & (uint)fStack_250);
    fStack_24c = (float)(int)(float)(~(uint)fStack_23c & (uint)fStack_24c);
    RenderFrameBorder((ImVec2)local_160,local_158,0.0);
    pos_00.x = (float)local_138._0_4_ + -1.0;
    pos_00.y = (float)local_258._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar
              ((ImDrawList *)this,pos_00,half_sz_00,local_178 + 2.0,(pIVar28->Style).Alpha);
  }
  EndGroup();
  if (auVar48[0] != '\0') {
    iVar24 = bcmp(local_58,pIVar23,local_b8);
    uVar25 = uVar25 & 0xff;
    if (iVar24 == 0) {
      uVar25 = 0;
    }
  }
  bVar22 = (byte)uVar25;
  if ((uVar25 & 1) != 0) {
    MarkItemEdited((pIVar28->LastItemData).ID);
  }
  PopID();
LAB_001ed6c7:
  return (bool)(bVar22 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags_PickerMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_PickerMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_PickerMask_;
    if (!(flags & ImGuiColorEditFlags_InputMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_InputMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_InputMask_;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        ColorEditRestoreHS(col, &H, &S, &V);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));

            // Greatly reduces hue jitter and reset to 0 when hue == 255 and color is rapidly modified using SV square.
            if (g.ColorEditLastColor == ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0)))
                H = g.ColorEditLastHue;
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H, S, V, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            g.ColorEditLastColor = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0));
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            ColorEditRestoreHS(col, &H, &S, &V);   // Fix local Hue as display below will use it immediately.
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, 0, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    PopID();

    return value_changed;
}